

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzerSettings.cpp
# Opt level: O0

void __thiscall I2cAnalyzerSettings::I2cAnalyzerSettings(I2cAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel *pAVar1;
  element_type *peVar2;
  ulong uVar3;
  Channel *pCVar4;
  uint uVar5;
  I2cAnalyzerSettings *this_local;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__I2cAnalyzerSettings_0010fd68;
  Channel::Channel(&this->mSdaChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::Channel(&this->mSclChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::auto_ptr
            (&this->mSdaChannelInterface,(element_type *)0x0);
  uVar3 = 0;
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::auto_ptr
            (&this->mSclChannelInterface,(element_type *)0x0);
  pAVar1 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar3);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(&this->mSdaChannelInterface,pAVar1);
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mSdaChannelInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar2,"SDA");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mSdaChannelInterface);
  pCVar4 = &this->mSdaChannel;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar2);
  pAVar1 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar4);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(&this->mSclChannelInterface,pAVar1);
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mSclChannelInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar2,"SCL");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mSclChannelInterface);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar2);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::get(&this->mSdaChannelInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::get(&this->mSclChannelInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar5 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar5,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar5,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar5,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSdaChannel,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSclChannel,true);
  return;
}

Assistant:

I2cAnalyzerSettings::I2cAnalyzerSettings() : mSdaChannel( UNDEFINED_CHANNEL ), mSclChannel( UNDEFINED_CHANNEL )
{
    mSdaChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mSdaChannelInterface->SetTitleAndTooltip( "SDA", "Serial Data Line" );
    mSdaChannelInterface->SetChannel( mSdaChannel );

    mSclChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mSclChannelInterface->SetTitleAndTooltip( "SCL", "Serial Clock Line" );
    mSclChannelInterface->SetChannel( mSclChannel );

    AddInterface( mSdaChannelInterface.get() );
    AddInterface( mSclChannelInterface.get() );

    // AddExportOption( 0, "Export as text/csv file", "text (*.txt);;csv (*.csv)" );
    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mSdaChannel, "SDA", false );
    AddChannel( mSclChannel, "SCL", false );
}